

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::FreeConstraintPS::FreeConstraintPS
          (FreeConstraintPS *this,FreeConstraintPS *old)

{
  int iVar1;
  
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_003afb68;
  (this->super_PostStep).m_name = (old->super_PostStep).m_name;
  iVar1 = (old->super_PostStep).nRows;
  (this->super_PostStep).nCols = (old->super_PostStep).nCols;
  (this->super_PostStep).nRows = iVar1;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (old->super_PostStep)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(old->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__FreeConstraintPS_003afc30;
  iVar1 = old->m_old_i;
  this->m_i = old->m_i;
  this->m_old_i = iVar1;
  DSVectorBase<double>::DSVectorBase(&this->m_row,&old->m_row);
  this->m_row_obj = old->m_row_obj;
  return;
}

Assistant:

FreeConstraintPS(const FreeConstraintPS& old)
         : PostStep(old)
         , m_i(old.m_i)
         , m_old_i(old.m_old_i)
         , m_row(old.m_row)
         , m_row_obj(old.m_row_obj)
      {}